

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

string * __thiscall deci::ast_while_t::EndLocationTag_abi_cxx11_(ast_while_t *this)

{
  int iVar1;
  allocator local_11;
  ast_while_t *local_10;
  ast_while_t *this_local;
  
  if (EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_ == '\0') {
    local_10 = this;
    iVar1 = __cxa_guard_acquire(&EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_,"while",&local_11);
      std::allocator<char>::~allocator((allocator<char> *)&local_11);
      __cxa_atexit(std::__cxx11::string::~string,EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_);
    }
  }
  return (string *)EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_;
}

Assistant:

const std::string &ast_while_t::EndLocationTag() const 
  {
    static const std::string whileText("while");
    return whileText;
  }